

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImplPrivate::emitReplyUploadProgress
          (QNetworkReplyHttpImplPrivate *this,qint64 bytesSent,qint64 bytesTotal)

{
  QNetworkReplyHttpImpl *_t2;
  ulong uVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  QNetworkReplyHttpImplPrivate *in_RDI;
  QNetworkReplyHttpImplPrivate *unaff_retaddr;
  QNetworkReplyHttpImpl *q;
  
  _t2 = q_func(in_RDI);
  if (((in_RDI->super_QNetworkReplyPrivate).isFinished & 1U) == 0) {
    setupTransferTimeout(unaff_retaddr);
    if (((in_RDI->super_QNetworkReplyPrivate).emitAllUploadProgressSignals & 1U) == 0) {
      uVar1 = QElapsedTimer::isValid();
      if ((((uVar1 & 1) != 0) && (in_RSI != in_RDX)) &&
         (lVar2 = QElapsedTimer::elapsed(), lVar2 < 100)) {
        return;
      }
      QElapsedTimer::start();
    }
    QNetworkReply::uploadProgress((QNetworkReply *)in_RDI,in_RDX,(qint64)_t2);
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::emitReplyUploadProgress(qint64 bytesSent, qint64 bytesTotal)
{
    Q_Q(QNetworkReplyHttpImpl);
    if (isFinished)
        return;

    setupTransferTimeout();

    if (!emitAllUploadProgressSignals) {
        //choke signal emissions, except the first and last signals which are unconditional
        if (uploadProgressSignalChoke.isValid()) {
            if (bytesSent != bytesTotal && uploadProgressSignalChoke.elapsed() < progressSignalInterval) {
                return;
            }
        }
        uploadProgressSignalChoke.start();
    }
    emit q->uploadProgress(bytesSent, bytesTotal);
}